

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

Timer _fill_random<long,phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
                (vector<long,_std::allocator<long>_> *v,
                parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *hash)

{
  size_t this;
  reference __x;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
  local_80;
  int local_44;
  pair<const_long,_long> local_40;
  ulong local_30;
  size_t sz;
  size_t i;
  parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
  *hash_local;
  vector<long,_std::allocator<long>_> *v_local;
  Timer timer;
  
  i = (size_t)hash;
  hash_local = (parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *)v;
  _fill<long>(v);
  _shuffle<long>((vector<long,_std::allocator<long>_> *)hash_local);
  Timer::Timer((Timer *)&v_local,true);
  sz = 0;
  local_30 = std::vector<long,_std::allocator<long>_>::size
                       ((vector<long,_std::allocator<long>_> *)hash_local);
  for (; this = i, sz < local_30; sz = sz + 1) {
    __x = std::vector<long,_std::allocator<long>_>::operator[]
                    ((vector<long,_std::allocator<long>_> *)hash_local,sz);
    local_44 = 0;
    std::pair<const_long,_long>::pair<long_&,_int,_true>(&local_40,__x,&local_44);
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
    ::insert<std::pair<const_long,_long>,_0,_0,_nullptr>
              (&local_80,
               (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
                *)this,&local_40);
  }
  return (time_point)(time_point)v_local;
}

Assistant:

Timer _fill_random(vector<T> &v, HT &hash)
{
    _fill<T>(v);
    _shuffle<T>(v);
    
    Timer timer(true);

    for (size_t i = 0, sz = v.size(); i < sz; ++i)
        hash.insert(typename HT::value_type(v[i], 0));
    return timer;
}